

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* lest::split_arguments
            (pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,texts *args)

{
  pointer pcVar1;
  text *ptVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  runtime_error *this;
  bool bVar6;
  _Alloc_hider _Var7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  pointer pbVar11;
  text opt;
  text val;
  text arg;
  texts in;
  bool local_200;
  bool local_1fc;
  bool local_1f8;
  bool local_1f4;
  bool local_1f0;
  bool local_1ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined4 local_1c8;
  seed_t local_1c4;
  undefined4 local_1c0;
  undefined4 local_1bc;
  undefined4 local_1b8;
  int local_1b4;
  ulong local_1b0;
  undefined1 *local_1a8;
  long local_1a0;
  undefined1 local_198 [16];
  value_type local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_150;
  text local_148;
  text local_128;
  text local_108;
  text local_e8;
  text local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar11 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_200 = false;
    bVar3 = false;
    local_1c0 = 0;
    local_1c4 = 0;
    local_1f8 = false;
    local_1fc = false;
    local_1f4 = false;
    local_1f0 = false;
    local_1ec = false;
    iVar4 = 1;
    uVar9 = 0;
    uVar10 = 0;
    uVar8 = 0;
    bVar6 = false;
  }
  else {
    local_1b4 = 1;
    bVar6 = true;
    local_1ec = false;
    local_1f0 = false;
    local_1f4 = false;
    local_1fc = false;
    local_1f8 = false;
    local_1c4 = 0;
    local_1c0 = 0;
    local_1c8 = 0;
    local_1bc = 0;
    local_1b8 = 0;
    bVar3 = false;
    local_1b0 = 0;
    local_200 = false;
    local_150 = __return_storage_ptr__;
    do {
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      local_1e8._M_string_length = 0;
      local_1e8.field_2._M_local_buf[0] = '\0';
      local_1a8 = local_198;
      local_1a0 = 0;
      local_198[0] = 0;
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      pcVar1 = (pbVar11->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,pcVar1,pcVar1 + pbVar11->_M_string_length);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,local_188._M_dataplus._M_p,
                 local_188._M_dataplus._M_p + local_188._M_string_length);
      split_option(&local_a8,&local_c8);
      std::__cxx11::string::_M_assign((string *)&local_1e8);
      std::__cxx11::string::_M_assign((string *)&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.second._M_dataplus._M_p != &local_a8.second.field_2) {
        operator_delete(local_a8.second._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.first._M_dataplus._M_p != &local_a8.first.field_2) {
        operator_delete(local_a8.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if ((bVar6) && (*local_1e8._M_dataplus._M_p == '-')) {
        iVar4 = std::__cxx11::string::compare((char *)&local_1e8);
        if (iVar4 == 0) goto LAB_001045c6;
        iVar4 = std::__cxx11::string::compare((char *)&local_1e8);
        if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_1e8), iVar4 == 0))
        {
          local_1ec = true;
LAB_0010464b:
          bVar6 = true;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_1e8);
          if ((iVar4 == 0) ||
             (iVar4 = std::__cxx11::string::compare((char *)&local_1e8), iVar4 == 0)) {
            local_1f0 = true;
            goto LAB_0010464b;
          }
          iVar4 = std::__cxx11::string::compare((char *)&local_1e8);
          if ((iVar4 == 0) ||
             (iVar4 = std::__cxx11::string::compare((char *)&local_1e8), iVar4 == 0)) {
            local_1f4 = true;
            goto LAB_0010464b;
          }
          iVar4 = std::__cxx11::string::compare((char *)&local_1e8);
          if ((iVar4 == 0) ||
             (iVar4 = std::__cxx11::string::compare((char *)&local_1e8), iVar4 == 0)) {
            local_1f8 = true;
            goto LAB_0010464b;
          }
          iVar4 = std::__cxx11::string::compare((char *)&local_1e8);
          if ((iVar4 == 0) ||
             (iVar4 = std::__cxx11::string::compare((char *)&local_1e8), iVar4 == 0)) {
            local_1fc = true;
            goto LAB_0010464b;
          }
          iVar4 = std::__cxx11::string::compare((char *)&local_1e8);
          if ((iVar4 == 0) ||
             (iVar4 = std::__cxx11::string::compare((char *)&local_1e8), iVar4 == 0)) {
            local_200 = true;
            goto LAB_0010464b;
          }
          uVar5 = std::__cxx11::string::compare((char *)&local_1e8);
          bVar6 = true;
          if (((int)uVar5 == 0) ||
             (uVar5 = std::__cxx11::string::compare((char *)&local_1e8), (int)uVar5 == 0)) {
            local_1b0 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
            goto LAB_001045c8;
          }
          iVar4 = std::__cxx11::string::compare((char *)&local_1e8);
          if ((iVar4 == 0) ||
             (iVar4 = std::__cxx11::string::compare((char *)&local_1e8), iVar4 == 0)) {
            bVar3 = true;
            goto LAB_0010464b;
          }
          uVar5 = std::__cxx11::string::compare((char *)&local_1e8);
          if (((int)uVar5 == 0) ||
             (uVar5 = std::__cxx11::string::compare((char *)&local_1e8), (int)uVar5 == 0)) {
            local_1c8 = (undefined4)CONCAT71((int7)((ulong)uVar5 >> 8),1);
            goto LAB_0010464b;
          }
          uVar5 = std::__cxx11::string::compare((char *)&local_1e8);
          bVar6 = true;
          if ((int)uVar5 == 0) {
            local_1c0 = (undefined4)CONCAT71((int7)((ulong)uVar5 >> 8),1);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&local_1e8);
            if ((iVar4 != 0) ||
               (iVar4 = std::__cxx11::string::compare((char *)&local_1a8), iVar4 != 0)) {
              iVar4 = std::__cxx11::string::compare((char *)&local_1e8);
              if ((iVar4 == 0) &&
                 (uVar5 = std::__cxx11::string::compare((char *)&local_1a8), (int)uVar5 == 0)) {
                local_1b8 = (undefined4)CONCAT71((int7)((ulong)uVar5 >> 8),1);
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)&local_1e8);
                if ((iVar4 != 0) ||
                   (uVar5 = std::__cxx11::string::compare((char *)&local_1a8), (int)uVar5 != 0)) {
                  iVar4 = std::__cxx11::string::compare((char *)&local_1e8);
                  if (iVar4 == 0) {
                    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_e8,"--random-seed","");
                    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_108,local_1a8,local_1a8 + local_1a0);
                    local_1c4 = seed(&local_e8,&local_108);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_108._M_dataplus._M_p != &local_108.field_2) {
                      operator_delete(local_108._M_dataplus._M_p);
                    }
                    ptVar2 = &local_e8;
                    _Var7._M_p = local_e8._M_dataplus._M_p;
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)&local_1e8);
                    if (iVar4 != 0) {
                      this = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::operator+(&local_50,"unrecognised option \'",&local_1e8);
                      std::operator+(&local_a8.first,&local_50,"\' (try option --help)");
                      std::runtime_error::runtime_error(this,(string *)&local_a8);
                      __cxa_throw(this,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_128,"--repeat","");
                    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_148,local_1a8,local_1a8 + local_1a0);
                    local_1b4 = repeat(&local_128,&local_148);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_148._M_dataplus._M_p != &local_148.field_2) {
                      operator_delete(local_148._M_dataplus._M_p);
                    }
                    ptVar2 = &local_128;
                    _Var7._M_p = local_128._M_dataplus._M_p;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var7._M_p != &ptVar2->field_2) {
                    operator_delete(_Var7._M_p);
                  }
                  goto LAB_001045c8;
                }
                local_1bc = (undefined4)CONCAT71((int7)((ulong)uVar5 >> 8),1);
              }
              goto LAB_0010464b;
            }
          }
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_168,&local_188);
LAB_001045c6:
        bVar6 = false;
      }
LAB_001045c8:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      if (local_1a8 != local_198) {
        operator_delete(local_1a8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 !=
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
    __return_storage_ptr__ = local_150;
    iVar4 = local_1b4;
    uVar9 = local_1bc;
    uVar10 = local_1c8;
    uVar8 = local_1b8;
    bVar6 = true;
    if ((local_1b0 & 1) == 0) {
      bVar6 = bVar3;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_68,&local_168);
  (__return_storage_ptr__->first).help = local_1ec;
  (__return_storage_ptr__->first).abort = local_1f0;
  (__return_storage_ptr__->first).count = local_1f4;
  (__return_storage_ptr__->first).list = local_1fc;
  (__return_storage_ptr__->first).tags = local_1f8;
  (__return_storage_ptr__->first).time = local_200;
  (__return_storage_ptr__->first).pass = bVar6;
  (__return_storage_ptr__->first).zen = bVar3;
  (__return_storage_ptr__->first).lexical = SUB41(uVar8,0);
  (__return_storage_ptr__->first).random = SUB41(uVar9,0);
  (__return_storage_ptr__->first).verbose = SUB41(uVar10,0);
  (__return_storage_ptr__->first).version = SUB41(local_1c0,0);
  (__return_storage_ptr__->first).repeat = iVar4;
  (__return_storage_ptr__->first).seed = local_1c4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&__return_storage_ptr__->second,&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<options, texts>
split_arguments( texts args )
{
    options option; texts in;

    bool in_options = true;

    for ( texts::iterator pos = args.begin(); pos != args.end() ; ++pos )
    {
        text opt, val, arg = *pos;
        tie( opt, val ) = split_option( arg );

        if ( in_options )
        {
            if      ( opt[0] != '-'                             ) { in_options     = false;           }
            else if ( opt == "--"                               ) { in_options     = false; continue; }
            else if ( opt == "-h"      || "--help"       == opt ) { option.help    =  true; continue; }
            else if ( opt == "-a"      || "--abort"      == opt ) { option.abort   =  true; continue; }
            else if ( opt == "-c"      || "--count"      == opt ) { option.count   =  true; continue; }
            else if ( opt == "-g"      || "--list-tags"  == opt ) { option.tags    =  true; continue; }
            else if ( opt == "-l"      || "--list-tests" == opt ) { option.list    =  true; continue; }
            else if ( opt == "-t"      || "--time"       == opt ) { option.time    =  true; continue; }
            else if ( opt == "-p"      || "--pass"       == opt ) { option.pass    =  true; continue; }
            else if ( opt == "-z"      || "--pass-zen"   == opt ) { option.zen     =  true; continue; }
            else if ( opt == "-v"      || "--verbose"    == opt ) { option.verbose =  true; continue; }
            else if (                     "--version"    == opt ) { option.version =  true; continue; }
            else if ( opt == "--order" && "declared"     == val ) { /* by definition */   ; continue; }
            else if ( opt == "--order" && "lexical"      == val ) { option.lexical =  true; continue; }
            else if ( opt == "--order" && "random"       == val ) { option.random  =  true; continue; }
            else if ( opt == "--random-seed" ) { option.seed   = seed  ( "--random-seed", val ); continue; }
            else if ( opt == "--repeat"      ) { option.repeat = repeat( "--repeat"     , val ); continue; }
            else throw std::runtime_error( "unrecognised option '" + opt + "' (try option --help)" );
        }
        in.push_back( arg );
    }
    option.pass = option.pass || option.zen;

    return std::make_pair( option, in );
}